

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaExist.c
# Opt level: O0

int Gia_ManQuantExist(Gia_Man_t *p0,int iLit,_func_int_void_ptr_int *pFuncCiToKeep,void *pData)

{
  int iVar1;
  Vec_Int_t *vQuantCis_00;
  Vec_Int_t *vQuantSide_00;
  Vec_Int_t *vQuantAnds_00;
  Vec_Int_t *vQuantAnds;
  Vec_Int_t *vQuantSide;
  Vec_Int_t *vQuantCis;
  int Res;
  void *pData_local;
  _func_int_void_ptr_int *pFuncCiToKeep_local;
  int iLit_local;
  Gia_Man_t *p0_local;
  
  vQuantCis_00 = Vec_IntAlloc(100);
  vQuantSide_00 = Vec_IntAlloc(100);
  vQuantAnds_00 = Vec_IntAlloc(100);
  iVar1 = Abc_Lit2Var(iLit);
  Gia_ManQuantCollect(p0,iVar1,pFuncCiToKeep,pData,vQuantCis_00,vQuantSide_00,vQuantAnds_00);
  iVar1 = Gia_ManQuantExistInt(p0,iLit,vQuantCis_00,vQuantSide_00,vQuantAnds_00);
  Vec_IntFree(vQuantCis_00);
  Vec_IntFree(vQuantSide_00);
  Vec_IntFree(vQuantAnds_00);
  return iVar1;
}

Assistant:

int Gia_ManQuantExist( Gia_Man_t * p0, int iLit, int(*pFuncCiToKeep)(void *, int), void * pData )
{
    int Res;
    Vec_Int_t * vQuantCis  = Vec_IntAlloc( 100 );
    Vec_Int_t * vQuantSide = Vec_IntAlloc( 100 );
    Vec_Int_t * vQuantAnds = Vec_IntAlloc( 100 );
    Gia_ManQuantCollect( p0, Abc_Lit2Var(iLit), pFuncCiToKeep, pData, vQuantCis, vQuantSide, vQuantAnds );
    Res = Gia_ManQuantExistInt( p0, iLit, vQuantCis, vQuantSide, vQuantAnds );
    Vec_IntFree( vQuantCis );
    Vec_IntFree( vQuantSide );
    Vec_IntFree( vQuantAnds );
    return Res;
}